

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<char_*,_char>_>::write_decimal<long_long>
          (basic_writer<fmt::v5::output_range<char_*,_char>_> *this,longlong value)

{
  iterator pcVar1;
  int iVar2;
  char *pcVar3;
  uint64_t n;
  
  n = -value;
  if (0 < value) {
    n = value;
  }
  iVar2 = internal::count_digits(n);
  if (value < 0) {
    pcVar1 = this->out_;
    this->out_ = pcVar1 + 1;
    *pcVar1 = '-';
  }
  pcVar3 = internal::format_decimal<char,unsigned_long,char*,fmt::v5::internal::no_thousands_sep>
                     (this->out_,n,iVar2);
  this->out_ = pcVar3;
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    int num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (is_negative)
      *it++ = static_cast<char_type>('-');
    it = internal::format_decimal<char_type>(it, abs_value, num_digits);
  }